

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

int __thiscall DIntermissionScreenCast::Ticker(DIntermissionScreenCast *this)

{
  int *piVar1;
  FState *pFVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  PClassActor *pPVar6;
  FState *pFVar7;
  int iVar8;
  
  piVar1 = &(this->super_DIntermissionScreen).mTicker;
  *piVar1 = *piVar1 + 1;
  iVar8 = this->casttics;
  this->casttics = iVar8 + -1;
  pFVar7 = this->caststate;
  bVar3 = iVar8 < 2 || pFVar7 == (FState *)0x0;
  if ((bool)(~bVar3 & 1) || pFVar7 == (FState *)0x0) {
    return -(uint)bVar3;
  }
  iVar8 = (int)pFVar7->Tics;
  if (pFVar7->TicRange != 0) {
    uVar4 = FRandom::GenRand32(&FState::pr_statetics);
    iVar8 = iVar8 + uVar4 % (pFVar7->TicRange + 1);
  }
  if (iVar8 == -1) {
    return -1;
  }
  pFVar7 = this->caststate;
  pFVar2 = pFVar7->NextState;
  if (pFVar2 == (FState *)0x0) {
    return -1;
  }
  if ((pFVar2 == pFVar7) && (this->castdeath != false)) {
    return -1;
  }
  if (pFVar7 != this->advplayerstate) {
    this->caststate = pFVar2;
    PlayAttackSound(this);
    iVar8 = this->castframes + 1;
    this->castframes = iVar8;
    if ((iVar8 == 0xc) && (this->castdeath == false)) {
      this->castattacking = true;
      pPVar6 = this->mClass;
      if (pPVar6 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) {
LAB_00301548:
        pFVar7 = this->mDefaults->MissileState;
LAB_00301553:
        this->caststate = pFVar7;
        this->basestate = pFVar7;
      }
      else {
        do {
          pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
          if (pPVar6 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) break;
        } while (pPVar6 != (PClassActor *)0x0);
        if (pPVar6 != (PClassActor *)0x0) goto LAB_00301548;
        uVar4 = this->castonmelee;
        pFVar7 = (&this->mDefaults->MeleeState)[uVar4 == 0];
        this->caststate = pFVar7;
        this->basestate = pFVar7;
        this->castonmelee = uVar4 ^ 1;
        if (pFVar7 == (FState *)0x0) {
          if (uVar4 == 1) {
            pFVar7 = this->mDefaults->MissileState;
          }
          else {
            pFVar7 = this->mDefaults->MeleeState;
          }
          goto LAB_00301553;
        }
      }
      PlayAttackSound(this);
    }
    if ((this->castattacking != true) ||
       ((this->castframes != 0x18 && (this->caststate != this->mDefaults->SeeState))))
    goto LAB_003015b2;
  }
  this->castattacking = false;
  this->castframes = 0;
  this->caststate = this->mDefaults->SeeState;
LAB_003015b2:
  pFVar7 = this->caststate;
  iVar8 = (int)pFVar7->Tics;
  if (pFVar7->TicRange != 0) {
    uVar4 = FRandom::GenRand32(&FState::pr_statetics);
    iVar8 = iVar8 + uVar4 % (pFVar7->TicRange + 1);
  }
  iVar5 = 0xf;
  if (iVar8 != -1) {
    iVar5 = iVar8;
  }
  this->casttics = iVar5;
  return 0;
}

Assistant:

int DIntermissionScreen::Ticker ()
{
	if (++mTicker >= mDuration && mDuration > 0) return -1;
	return 0;
}